

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O3

void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  char *pSop;
  ulong uVar5;
  uint uVar6;
  int *__ptr;
  void *pvVar7;
  Vec_Int_t *p;
  int *piVar8;
  void *__ptr_00;
  Vec_Int_t *p_00;
  int *piVar9;
  uint *__ptr_01;
  long lVar10;
  void *pvVar11;
  char *pcVar12;
  int iVar13;
  undefined4 uVar14;
  Vec_Ptr_t *pVVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong __n;
  uint local_6c;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                  ,0xa5,"void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *)");
  }
  __ptr = (int *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar7 = malloc(100);
  *(void **)(__ptr + 2) = pvVar7;
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar8 = (int *)malloc(400);
  p->pArray = piVar8;
  __ptr_00 = malloc(400);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_00->pArray = piVar9;
  __ptr_01 = (uint *)malloc(0x10);
  __ptr_01[0] = 100;
  __ptr_01[1] = 0;
  pvVar7 = malloc(400);
  *(void **)(__ptr_01 + 2) = pvVar7;
  pVVar15 = pNtk->vObjs;
  if (0 < pVVar15->nSize) {
    local_6c = 100;
    lVar17 = 0;
    do {
      pvVar7 = pVVar15->pArray[lVar17];
      if ((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) {
        pSop = *(char **)((long)pvVar7 + 0x38);
        uVar6 = Abc_SopGetVarNum(pSop);
        if (uVar6 != *(uint *)((long)pvVar7 + 0x1c)) {
          __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcFanOrder.c"
                        ,0xaf,"void Abc_NtkOrderFaninsByLitCountAndCubeCount(Abc_Ntk_t *)");
        }
        lVar10 = (long)(int)uVar6;
        if ((int)local_6c < (int)uVar6) {
          if (__ptr_00 == (void *)0x0) {
            __ptr_00 = malloc(lVar10 * 4);
          }
          else {
            __ptr_00 = realloc(__ptr_00,lVar10 * 4);
          }
          local_6c = uVar6;
          if (__ptr_00 == (void *)0x0) goto LAB_001c8d79;
        }
        __n = (ulong)uVar6;
        if (0 < (int)uVar6) {
          memset(__ptr_00,0,__n * 4);
        }
        if ((int)*__ptr_01 < (int)uVar6) {
          if (*(void **)(__ptr_01 + 2) == (void *)0x0) {
            pvVar11 = malloc(lVar10 * 4);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr_01 + 2),lVar10 * 4);
          }
          *(void **)(__ptr_01 + 2) = pvVar11;
          if (pvVar11 == (void *)0x0) {
LAB_001c8d79:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *__ptr_01 = uVar6;
        }
        if (0 < (int)uVar6) {
          memset(*(void **)(__ptr_01 + 2),0,__n * 4);
        }
        __ptr_01[1] = uVar6;
        if (*pSop != '\0') {
          iVar13 = 0;
          pcVar12 = pSop;
          do {
            if (0 < (int)uVar6) {
              uVar20 = 0;
              do {
                if (pcVar12[uVar20] != '-') {
                  piVar8 = (int *)((long)__ptr_00 + uVar20 * 4);
                  *piVar8 = *piVar8 + 1;
                  *(int *)(*(long *)(__ptr_01 + 2) + uVar20 * 4) = iVar13;
                }
                uVar20 = uVar20 + 1;
              } while (__n != uVar20);
            }
            iVar13 = iVar13 + 1;
            pcVar19 = pcVar12 + (int)(uVar6 + 3);
            pcVar12 = pcVar12 + (int)(uVar6 + 3);
          } while (*pcVar19 != '\0');
        }
        if ((int)uVar6 < 1) {
          p->nSize = 0;
LAB_001c8b33:
          piVar8 = p->pArray;
        }
        else {
          uVar20 = 0;
          do {
            uVar14 = 1000000000;
            if (*(int *)((long)__ptr_00 + uVar20 * 4) == 1) {
              uVar14 = *(undefined4 *)(*(long *)(__ptr_01 + 2) + uVar20 * 4);
            }
            *(undefined4 *)((long)__ptr_00 + uVar20 * 4) = uVar14;
            uVar20 = uVar20 + 1;
          } while (__n != uVar20);
          p->nSize = 0;
          if ((int)uVar6 < 1) goto LAB_001c8b33;
          uVar18 = 0;
          do {
            Vec_IntPush(p,uVar18);
            uVar18 = uVar18 + 1;
          } while (uVar6 != uVar18);
          piVar8 = p->pArray;
          if (uVar6 != 1) {
            uVar16 = 1;
            uVar20 = 0;
            do {
              uVar1 = uVar20 + 1;
              uVar22 = uVar20 & 0xffffffff;
              uVar21 = uVar16;
              do {
                uVar18 = piVar8[uVar21];
                if (((long)(int)uVar18 < 0) || (uVar6 <= uVar18)) {
LAB_001c8d5a:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar4 = piVar8[(int)uVar22];
                if (((long)(int)uVar4 < 0) || (uVar6 <= uVar4)) goto LAB_001c8d5a;
                uVar5 = uVar21 & 0xffffffff;
                if (*(int *)((long)__ptr_00 + (long)(int)uVar4 * 4) <=
                    *(int *)((long)__ptr_00 + (long)(int)uVar18 * 4)) {
                  uVar5 = uVar22;
                }
                uVar22 = uVar5;
                uVar21 = uVar21 + 1;
              } while (__n != uVar21);
              iVar13 = piVar8[uVar20];
              piVar8[uVar20] = piVar8[(int)uVar22];
              piVar8[(int)uVar22] = iVar13;
              uVar16 = uVar16 + 1;
              uVar20 = uVar1;
            } while (uVar1 != uVar6 - 1);
          }
        }
        iVar13 = Abc_SopGetCubeNum(pSop);
        lVar10 = lVar10 + 3;
        iVar13 = iVar13 * (int)lVar10;
        pcVar12 = *(char **)(__ptr + 2);
        if (*__ptr <= iVar13) {
          iVar13 = iVar13 + 1;
          if (pcVar12 == (char *)0x0) {
            pcVar12 = (char *)malloc((long)iVar13);
          }
          else {
            pcVar12 = (char *)realloc(pcVar12,(long)iVar13);
          }
          *(char **)(__ptr + 2) = pcVar12;
          *__ptr = iVar13;
        }
        iVar13 = Abc_SopGetCubeNum(pSop);
        memcpy(pcVar12,pSop,(long)(iVar13 * (int)lVar10 + 1));
        cVar3 = *pcVar12;
        pcVar19 = pSop;
        while (cVar3 != '\0') {
          if (0 < (int)uVar6) {
            memset(pcVar19,0x2d,__n);
            uVar20 = 0;
            do {
              if ((pcVar12[piVar8[uVar20]] & 0xfeU) == 0x30) {
                pcVar19[uVar20] = pcVar12[piVar8[uVar20]];
              }
              uVar20 = uVar20 + 1;
            } while (__n != uVar20);
          }
          pcVar19 = pcVar19 + lVar10;
          pcVar2 = pcVar12 + lVar10;
          pcVar12 = pcVar12 + lVar10;
          cVar3 = *pcVar2;
        }
        *(char **)((long)pvVar7 + 0x38) = pSop;
        p_00->nSize = 0;
        if ((int)uVar6 < 1) {
          *(undefined4 *)((long)pvVar7 + 0x1c) = 0;
        }
        else {
          uVar20 = 0;
          do {
            Vec_IntPush(p_00,*(int *)(*(long *)((long)pvVar7 + 0x20) + (long)piVar8[uVar20] * 4));
            uVar20 = uVar20 + 1;
          } while (__n != uVar20);
          iVar13 = p_00->nSize;
          *(undefined4 *)((long)pvVar7 + 0x1c) = 0;
          if (0 < (long)iVar13) {
            piVar9 = p_00->pArray;
            lVar10 = 0;
            do {
              Vec_IntPush((Vec_Int_t *)((long)pvVar7 + 0x18),piVar9[lVar10]);
              lVar10 = lVar10 + 1;
            } while (iVar13 != lVar10);
          }
        }
      }
      lVar17 = lVar17 + 1;
      pVVar15 = pNtk->vObjs;
    } while (lVar17 < pVVar15->nSize);
    pvVar7 = *(void **)(__ptr_01 + 2);
  }
  if (pvVar7 != (void *)0x0) {
    free(pvVar7);
  }
  free(__ptr_01);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
    piVar8 = p->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(p);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkOrderFaninsByLitCountAndCubeCount( Abc_Ntk_t * pNtk )
{
    // assuming that the fanins are sorted by the number of literals in each cube
    // this procedure sorts the literals appearing only once by the number of their cube
    Vec_Int_t * vOrder;
    Vec_Int_t * vCounts;
    Vec_Int_t * vFanins;
    Vec_Int_t * vCubeNum;
    Vec_Str_t * vStore;
    Abc_Obj_t * pNode;
    char * pSop, * pSopNew;
    char * pCube, * pCubeNew;
    int nVars, i, v, iCube, * pOrder;
    assert( Abc_NtkHasSop(pNtk) );
    vStore = Vec_StrAlloc( 100 );
    vOrder = Vec_IntAlloc( 100 );
    vCounts = Vec_IntAlloc( 100 );
    vFanins = Vec_IntAlloc( 100 );
    vCubeNum = Vec_IntAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        pSop = (char *)pNode->pData;
        nVars = Abc_SopGetVarNum(pSop);
        assert( nVars == Abc_ObjFaninNum(pNode) );
        // count literals and remember the cube where each literal appears
        Vec_IntFill( vCounts, nVars, 0 );
        Vec_IntFill( vCubeNum, nVars, 0 );
        iCube = 0;
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                if ( pCube[v] != '-' )
                {
                    Vec_IntAddToEntry( vCounts, v, 1 );
                    Vec_IntWriteEntry( vCubeNum, v, iCube );
                }
            iCube++;
        }
        // create new order
        for ( v = 0; v < nVars; v++ )
            if ( Vec_IntEntry(vCounts, v) == 1 )
                Vec_IntWriteEntry( vCounts, v, Vec_IntEntry(vCubeNum, v) );
            else
                Vec_IntWriteEntry( vCounts, v, ABC_INFINITY );
        // find good order
        Vec_IntClear( vOrder );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vOrder, v );
        pOrder = Vec_IntArray(vOrder);
        Vec_IntSelectSortCost( pOrder, nVars, vCounts );
        // copy the cover
        Vec_StrGrow( vStore, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        memcpy( Vec_StrArray(vStore), pSop, Abc_SopGetCubeNum(pSop) * (nVars + 3) + 1 );
        pSopNew = pCubeNew = pSop;
        pSop = Vec_StrArray(vStore);
        // generate permuted one
        Abc_SopForEachCube( pSop, nVars, pCube )
        {
            for ( v = 0; v < nVars; v++ )
                pCubeNew[v] = '-';
            for ( v = 0; v < nVars; v++ )
                if ( pCube[pOrder[v]] == '0' )
                    pCubeNew[v] = '0';
                else if ( pCube[pOrder[v]] == '1' )
                    pCubeNew[v] = '1';
            pCubeNew += nVars + 3;
        }
        pNode->pData = pSopNew;
        // generate the fanin order
        Vec_IntClear( vFanins );
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vFanins, Abc_ObjFaninId( pNode, pOrder[v] ) );
        Vec_IntClear( &pNode->vFanins );
        Vec_IntAppend( &pNode->vFanins, vFanins );
    }
    Vec_IntFree( vCubeNum );
    Vec_IntFree( vFanins );
    Vec_IntFree( vCounts );
    Vec_IntFree( vOrder );
    Vec_StrFree( vStore );
}